

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

void linenoiseAtExit(void)

{
  char **__ptr;
  int in_EDI;
  ulong uVar1;
  ulong uVar2;
  
  disableRawMode(in_EDI);
  __ptr = history;
  if (history != (char **)0x0) {
    uVar2 = 0;
    uVar1 = (ulong)(uint)history_len;
    if (history_len < 1) {
      uVar1 = uVar2;
    }
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      free(__ptr[uVar2]);
    }
    free(__ptr);
    return;
  }
  return;
}

Assistant:

static void linenoiseAtExit(void) {
    disableRawMode(STDIN_FILENO);
    freeHistory();
}